

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

int __thiscall r_code::list<r_code::Code_*>::remove(list<r_code::Code_*> *this,char *__filename)

{
  pointer pcVar1;
  const_iterator cVar2;
  const_iterator local_10;
  
  local_10.super__iterator._cell = this->used_cells_head;
  if (local_10.super__iterator._cell != list<r_code::Code*>::end_iterator) {
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (*(long *)(pcVar1 + local_10.super__iterator._cell * 0x18 + 0x10) == *(long *)__filename) {
        local_10._list = this;
        cVar2 = erase(this,&local_10);
        local_10.super__iterator = cVar2.super__iterator._cell;
        break;
      }
      local_10.super__iterator._cell = *(int64_t *)(pcVar1 + local_10.super__iterator._cell * 0x18);
    } while (local_10.super__iterator._cell != list<r_code::Code*>::end_iterator);
  }
  return (int)local_10.super__iterator._cell;
}

Assistant:

void remove(const T &t)
    {
        const_iterator i(this, used_cells_head);

        for (; i != end_iterator; ++i) {
            if ((*i) == t) {
                erase(i);
                return;
            }
        }
    }